

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::IsGroupOf_PDU::IsGroupOf_PDU(IsGroupOf_PDU *this)

{
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__IsGroupOf_PDU_00227fa0;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_GroupedEntityID);
  this->m_ui8GrpdEntCat = '\0';
  this->m_ui8NumOfGroupedEnts = '\0';
  *(undefined8 *)&this->m_ui32Padding1 = 0;
  *(undefined8 *)((long)&this->m_f64GrpLat + 4) = 0;
  *(undefined8 *)((long)&this->m_f64GrpLon + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_vpGED).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->m_vpGED).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vpGED).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  (this->super_Header).super_Header6.m_ui8PDUType = '\"';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\a';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x28;
  return;
}

Assistant:

IsGroupOf_PDU::IsGroupOf_PDU() :
    m_ui8GrpdEntCat( 0 ),
    m_ui8NumOfGroupedEnts( 0 ),
    m_ui32Padding1( 0 ),
    m_f64GrpLat( 0 ),
    m_f64GrpLon( 0 )
{
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
    m_ui8ProtocolFamily = EntityManagement;
    m_ui8PDUType = IsGroupOf_PDU_Type;
    m_ui16PDULength = IS_GROUP_OF_PDU_SIZE;
}